

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewEdgeCalculator.cpp
# Opt level: O0

bool __thiscall
NewEdgeCalculator::similarityCriterion
          (NewEdgeCalculator *this,AlignmentRecord *a1,
          vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_ap1,
          AlignmentRecord *a2,
          vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *cov_ap2,
          double probM,double prob0,int tc,int cc)

{
  unsigned_long uVar1;
  long lVar2;
  unsigned_long *puVar3;
  vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *in_RDX;
  long in_RDI;
  vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *in_R8;
  int in_R9D;
  bool bVar4;
  double in_XMM0_Qa;
  double dVar5;
  double in_XMM1_Qa;
  undefined1 auVar6 [16];
  int in_stack_00000008;
  double final_prob;
  double potence;
  double prob;
  double MIN_OVERLAP;
  double cutoff;
  AlignmentRecord *in_stack_fffffffffffffe78;
  double dVar7;
  double local_158;
  double local_150;
  size_type local_148;
  size_type local_140;
  byte local_131;
  string local_130 [32];
  string local_110 [32];
  double local_f0;
  byte local_e1;
  string local_e0 [32];
  string local_c0 [35];
  byte local_9d;
  string local_90 [32];
  string local_70 [32];
  double local_50;
  int local_44;
  double local_40;
  double local_38;
  vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *local_30;
  vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_> *local_20;
  bool local_1;
  
  local_50 = 0.0;
  local_44 = in_R9D;
  local_40 = in_XMM1_Qa;
  local_38 = in_XMM0_Qa;
  local_30 = in_R8;
  local_20 = in_RDX;
  AlignmentRecord::getName_abi_cxx11_(in_stack_fffffffffffffe78);
  lVar2 = std::__cxx11::string::find((char *)local_70,0x3047ff);
  local_9d = 0;
  bVar4 = false;
  if (lVar2 != -1) {
    AlignmentRecord::getName_abi_cxx11_(in_stack_fffffffffffffe78);
    local_9d = 1;
    lVar2 = std::__cxx11::string::find((char *)local_90,0x3047ff);
    bVar4 = lVar2 != -1;
  }
  if ((local_9d & 1) != 0) {
    std::__cxx11::string::~string(local_90);
  }
  std::__cxx11::string::~string(local_70);
  if (bVar4) {
    local_50 = log10(*(double *)(in_RDI + 0x30));
  }
  else {
    AlignmentRecord::getName_abi_cxx11_(in_stack_fffffffffffffe78);
    lVar2 = std::__cxx11::string::find((char *)local_c0,0x3047ff);
    local_e1 = 0;
    bVar4 = true;
    if (lVar2 == -1) {
      AlignmentRecord::getName_abi_cxx11_(in_stack_fffffffffffffe78);
      local_e1 = 1;
      lVar2 = std::__cxx11::string::find((char *)local_e0,0x3047ff);
      bVar4 = lVar2 != -1;
    }
    if ((local_e1 & 1) != 0) {
      std::__cxx11::string::~string(local_e0);
    }
    std::__cxx11::string::~string(local_c0);
    if (bVar4) {
      local_50 = log10(*(double *)(in_RDI + 0x20));
    }
    else {
      local_50 = log10(*(double *)(in_RDI + 0x28));
    }
  }
  local_f0 = 0.0;
  AlignmentRecord::getName_abi_cxx11_(in_stack_fffffffffffffe78);
  lVar2 = std::__cxx11::string::find((char *)local_110,0x3047ff);
  local_131 = 0;
  bVar4 = false;
  if (lVar2 != -1) {
    AlignmentRecord::getName_abi_cxx11_(in_stack_fffffffffffffe78);
    local_131 = 1;
    lVar2 = std::__cxx11::string::find((char *)local_130,0x3047ff);
    bVar4 = lVar2 != -1;
  }
  if ((local_131 & 1) != 0) {
    std::__cxx11::string::~string(local_130);
  }
  std::__cxx11::string::~string(local_110);
  if (bVar4) {
    local_f0 = *(double *)(in_RDI + 8);
  }
  else {
    local_f0 = *(double *)(in_RDI + 0x10);
  }
  dVar5 = (double)in_stack_00000008;
  dVar7 = local_f0;
  local_140 = std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::
              size(local_20);
  local_148 = std::vector<AlignmentRecord::mapValue,_std::allocator<AlignmentRecord::mapValue>_>::
              size(local_30);
  puVar3 = std::min<unsigned_long>(&local_140,&local_148);
  uVar1 = *puVar3;
  auVar6._8_4_ = (int)(uVar1 >> 0x20);
  auVar6._0_8_ = uVar1;
  auVar6._12_4_ = 0x45300000;
  if (dVar7 * ((auVar6._8_8_ - 1.9342813113834067e+25) +
              ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) < dVar5) {
    if ((*(byte *)(in_RDI + 0x39) & 1) == 0) {
      local_150 = log10(local_38);
      local_150 = local_150 + local_40;
      in_stack_00000008 = in_stack_00000008 + local_44;
    }
    else {
      local_150 = log10(local_38);
    }
    local_158 = 1.0 / (double)in_stack_00000008;
    local_1 = local_50 <= local_150 * local_158;
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool NewEdgeCalculator::similarityCriterion(const AlignmentRecord & a1, const std::vector<AlignmentRecord::mapValue> &cov_ap1, const AlignmentRecord & a2, const std::vector<AlignmentRecord::mapValue> &cov_ap2, double probM, double prob0, int tc, int cc) const{

    //Threshold for probability that reads were sampled from same haplotype
    double cutoff = 0;
    if (a1.getName().find("Clique") != string::npos && a2.getName().find("Clique") != string::npos) {
        cutoff = std::log10(this->EDGE_QUASI_CUTOFF);
    } else if (a1.getName().find("Clique") != string::npos || a2.getName().find("Clique") != string::npos) {
        cutoff = std::log10(this->EDGE_QUASI_CUTOFF_MIXED);
    } else {
        cutoff = std::log10(this->EDGE_QUASI_CUTOFF_SINGLE);
    }

    //Threshold for Overlap of Read Alignments
    double MIN_OVERLAP = 0;
    if (a1.getName().find("Clique") != string::npos && a2.getName().find("Clique") != string::npos) {
        MIN_OVERLAP = MIN_OVERLAP_CLIQUES;
    } else {
        MIN_OVERLAP = MIN_OVERLAP_SINGLE;
    }
    //double ratio = (float)cc/tc;
    if (cc<=MIN_OVERLAP*std::min(cov_ap1.size(),cov_ap2.size())) return false;
    double prob;
    double potence;
    /*if((double)cc/tc<=0.15 && probM >= 0.8 && MIN_OVERLAP==0.1){
        prob = probM;
        potence = 1.0/(cc);
    } else {*/
    //TEST to see what happens if prob0 is neglected
    if(this->NOPROB0){
        prob = std::log10(probM);
        potence = 1.0/cc;
    } else {
        prob = std::log10(probM) + prob0;
        potence = 1.0/(cc+tc);
    }
    //}
    double final_prob = prob*potence;
    //cout << "Final prob: " << final_prob << endl;
    return final_prob >= cutoff;
}